

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.h
# Opt level: O0

float GD::inline_predict(vw *all,example *ec)

{
  undefined8 in_RSI;
  example_predict *in_RDI;
  bool unaff_retaddr;
  bool in_stack_0000001f;
  sparse_parameters *in_stack_00000020;
  float local_14;
  float initial;
  
  initial = (float)((ulong)in_RSI >> 0x20);
  if ((in_RDI->feature_space[0x83].indicies.erase_count & 1) == 0) {
    local_14 = inline_predict<dense_parameters>
                         ((dense_parameters *)in_stack_00000020,in_stack_0000001f,(bool *)all,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)ec,unaff_retaddr,in_RDI,initial);
  }
  else {
    local_14 = inline_predict<sparse_parameters>
                         (in_stack_00000020,in_stack_0000001f,(bool *)all,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)ec,unaff_retaddr,in_RDI,initial);
  }
  return local_14;
}

Assistant:

inline float inline_predict(vw& all, example& ec)
{
  return all.weights.sparse ? inline_predict<sparse_parameters>(all.weights.sparse_weights, all.ignore_some_linear,
                                  all.ignore_linear, all.interactions, all.permutations, ec, ec.l.simple.initial)
                            : inline_predict<dense_parameters>(all.weights.dense_weights, all.ignore_some_linear,
                                  all.ignore_linear, all.interactions, all.permutations, ec, ec.l.simple.initial);
}